

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# red_black_tree.hpp
# Opt level: O0

void __thiscall
nestl::impl::detail::
rb_tree<int,_int,_nestl::impl::detail::identity<int>,_std::less<int>,_nestl::allocator<int>_>::
m_erase(rb_tree<int,_int,_nestl::impl::detail::identity<int>,_std::less<int>,_nestl::allocator<int>_>
        *this,link_type x)

{
  link_type prVar1;
  link_type y;
  link_type x_local;
  rb_tree<int,_int,_nestl::impl::detail::identity<int>,_std::less<int>,_nestl::allocator<int>_>
  *this_local;
  
  y = x;
  while (y != (link_type)0x0) {
    prVar1 = s_right(&y->super_rb_tree_node_base);
    m_erase(this,prVar1);
    prVar1 = s_left(&y->super_rb_tree_node_base);
    m_destroy_node(this,y);
    y = prVar1;
  }
  return;
}

Assistant:

void
rb_tree<Key, Val, KeyOfValue, Compare, Alloc>::m_erase(link_type x) NESTL_NOEXCEPT_SPEC
{
    // Erase without rebalancing.
    while (x != 0)
    {
        m_erase(s_right(x));
        link_type y = s_left(x);
        m_destroy_node(x);
        x = y;
    }
}